

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdlib.c
# Opt level: O0

CrispyValue std_list_append(CrispyValue *value,Vm *vm)

{
  ObjString *object;
  CrispyValue CVar1;
  CrispyValue CVar2;
  ObjList *list;
  Vm *vm_local;
  CrispyValue *value_local;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 local_10;
  
  if ((value->type == OBJECT) && (((value->field_1).o_value)->type == OBJ_LIST)) {
    CVar1._4_4_ = 0;
    CVar1.type = value[1].type;
    CVar1.field_1.p_value = value[1].field_1.p_value;
    list_append((ObjList *)(value->field_1).o_value,CVar1);
    value_local = *(CrispyValue **)value;
    local_10 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)(value->field_1).p_value;
  }
  else {
    vm->err_flag = true;
    object = new_string(vm,"You can only append to list",0x1b);
    CVar1 = create_object(&object->object);
    local_10 = CVar1.field_1;
    value_local = (CrispyValue *)(ulong)CVar1.type;
  }
  CVar2._0_8_ = (ulong)value_local & 0xffffffff;
  CVar2.field_1.p_value = local_10.p_value;
  return CVar2;
}

Assistant:

CrispyValue std_list_append(CrispyValue *value, Vm *vm) {
    if (value->type != OBJECT || value->o_value->type != OBJ_LIST) {
        vm->err_flag = true;
        return create_object((Object *) new_string(vm, "You can only append to list", 27));
    }

    ObjList *list = (ObjList *) value->o_value;
    list_append(list, value[1]);
    return value[0];
}